

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O0

int mbedtls_cipher_cmac(mbedtls_cipher_info_t *cipher_info,uchar *key,size_t keylen,uchar *input,
                       size_t ilen,uchar *output)

{
  int local_94;
  undefined1 local_90 [4];
  int ret;
  mbedtls_cipher_context_t ctx;
  uchar *output_local;
  size_t ilen_local;
  uchar *input_local;
  size_t keylen_local;
  uchar *key_local;
  mbedtls_cipher_info_t *cipher_info_local;
  
  if ((((cipher_info == (mbedtls_cipher_info_t *)0x0) || (key == (uchar *)0x0)) ||
      (input == (uchar *)0x0)) || (output == (uchar *)0x0)) {
    cipher_info_local._4_4_ = -0x6100;
  }
  else {
    ctx.cmac_ctx = (mbedtls_cmac_context_t *)output;
    mbedtls_cipher_init((mbedtls_cipher_context_t *)local_90);
    local_94 = mbedtls_cipher_setup((mbedtls_cipher_context_t *)local_90,cipher_info);
    if (((local_94 == 0) &&
        (local_94 = mbedtls_cipher_cmac_starts((mbedtls_cipher_context_t *)local_90,key,keylen),
        local_94 == 0)) &&
       (local_94 = mbedtls_cipher_cmac_update((mbedtls_cipher_context_t *)local_90,input,ilen),
       local_94 == 0)) {
      local_94 = mbedtls_cipher_cmac_finish
                           ((mbedtls_cipher_context_t *)local_90,(ctx.cmac_ctx)->state);
    }
    mbedtls_cipher_free((mbedtls_cipher_context_t *)local_90);
    cipher_info_local._4_4_ = local_94;
  }
  return cipher_info_local._4_4_;
}

Assistant:

int mbedtls_cipher_cmac(const mbedtls_cipher_info_t *cipher_info,
                        const unsigned char *key, size_t keylen,
                        const unsigned char *input, size_t ilen,
                        unsigned char *output)
{
    mbedtls_cipher_context_t ctx;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if (cipher_info == NULL || key == NULL || input == NULL || output == NULL) {
        return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    mbedtls_cipher_init(&ctx);

    if ((ret = mbedtls_cipher_setup(&ctx, cipher_info)) != 0) {
        goto exit;
    }

    ret = mbedtls_cipher_cmac_starts(&ctx, key, keylen);
    if (ret != 0) {
        goto exit;
    }

    ret = mbedtls_cipher_cmac_update(&ctx, input, ilen);
    if (ret != 0) {
        goto exit;
    }

    ret = mbedtls_cipher_cmac_finish(&ctx, output);

exit:
    mbedtls_cipher_free(&ctx);

    return ret;
}